

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

char * VulkanUtilities::VkAccessFlagBitToString(VkAccessFlagBits Bit)

{
  Char *pCVar1;
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  VkAccessFlagBits Bit_local;
  
  msg.field_2._12_4_ = Bit;
  if ((Bit == VK_ACCESS_NONE) ||
     ((Bit & Bit - VK_ACCESS_INDIRECT_COMMAND_READ_BIT) != VK_ACCESS_NONE)) {
    Diligent::FormatString<char[23]>((string *)local_38,(char (*) [23])"Single bit is expected");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"VkAccessFlagBitToString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
               ,0x29a);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (msg.field_2._12_4_ == 1) {
    pcStack_10 = "VK_ACCESS_INDIRECT_COMMAND_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 2) {
    pcStack_10 = "VK_ACCESS_INDEX_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 4) {
    pcStack_10 = "VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 8) {
    pcStack_10 = "VK_ACCESS_UNIFORM_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 0x10) {
    pcStack_10 = "VK_ACCESS_INPUT_ATTACHMENT_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 0x20) {
    pcStack_10 = "VK_ACCESS_SHADER_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 0x40) {
    pcStack_10 = "VK_ACCESS_SHADER_WRITE_BIT";
  }
  else if (msg.field_2._12_4_ == 0x80) {
    pcStack_10 = "VK_ACCESS_COLOR_ATTACHMENT_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 0x100) {
    pcStack_10 = "VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT";
  }
  else if (msg.field_2._12_4_ == 0x200) {
    pcStack_10 = "VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 0x400) {
    pcStack_10 = "VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT";
  }
  else if (msg.field_2._12_4_ == 0x800) {
    pcStack_10 = "VK_ACCESS_TRANSFER_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 0x1000) {
    pcStack_10 = "VK_ACCESS_TRANSFER_WRITE_BIT";
  }
  else if (msg.field_2._12_4_ == 0x2000) {
    pcStack_10 = "VK_ACCESS_HOST_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 0x4000) {
    pcStack_10 = "VK_ACCESS_HOST_WRITE_BIT";
  }
  else if (msg.field_2._12_4_ == 0x8000) {
    pcStack_10 = "VK_ACCESS_MEMORY_READ_BIT";
  }
  else if (msg.field_2._12_4_ == 0x10000) {
    pcStack_10 = "VK_ACCESS_MEMORY_WRITE_BIT";
  }
  else if (msg.field_2._12_4_ == 0x200000) {
    pcStack_10 = "VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR";
  }
  else if (msg.field_2._12_4_ == 0x400000) {
    pcStack_10 = "VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR";
  }
  else {
    Diligent::FormatString<char[15]>((string *)local_68,(char (*) [15])"Unexpected bit");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"VkAccessFlagBitToString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
               ,0x2b3);
    std::__cxx11::string::~string((string *)local_68);
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* VkAccessFlagBitToString(VkAccessFlagBits Bit)
{
    VERIFY(Bit != 0 && (Bit & (Bit - 1)) == 0, "Single bit is expected");
    switch (Bit)
    {
        // clang-format off
#define ACCESS_FLAG_BIT_TO_STRING(ACCESS_FLAG_BIT)case ACCESS_FLAG_BIT: return #ACCESS_FLAG_BIT;
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_INDIRECT_COMMAND_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_INDEX_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_UNIFORM_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_INPUT_ATTACHMENT_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_SHADER_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_SHADER_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_COLOR_ATTACHMENT_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_TRANSFER_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_TRANSFER_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_HOST_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_HOST_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_MEMORY_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_MEMORY_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR)
#undef ACCESS_FLAG_BIT_TO_STRING
        default: UNEXPECTED("Unexpected bit"); return "";
            // clang-format on
    }
}